

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O2

void __thiscall ON_Linetype::ON_Linetype(ON_Linetype *this,ON_Linetype *src)

{
  uchar uVar1;
  LineCapStyle LVar2;
  LineJoinStyle LVar3;
  ON_LinetypePrivate *this_00;
  
  ON_ModelComponent::ON_ModelComponent
            (&this->super_ON_ModelComponent,LinePattern,&src->super_ON_ModelComponent);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00824ca8;
  this->m_private = (ON_LinetypePrivate *)0x0;
  uVar1 = src->m_is_locked_bits;
  LVar2 = src->m_cap_style;
  LVar3 = src->m_join_style;
  this->m_is_set_bits = src->m_is_set_bits;
  this->m_is_locked_bits = uVar1;
  this->m_cap_style = LVar2;
  this->m_join_style = LVar3;
  this->m_width = src->m_width;
  this->m_width_units = src->m_width_units;
  this->m_reserved[0] = '\0';
  this->m_reserved[1] = '\0';
  this->m_reserved[2] = '\0';
  this->m_reserved[3] = '\0';
  this->m_reserved[3] = '\0';
  this->m_reserved[4] = '\0';
  this->m_reserved[5] = '\0';
  this->m_reserved[6] = '\0';
  this_00 = (ON_LinetypePrivate *)operator_new(0x38);
  ON_LinetypePrivate::ON_LinetypePrivate(this_00,src->m_private);
  this->m_private = this_00;
  return;
}

Assistant:

ON_Linetype::ON_Linetype( const ON_Linetype& src )
  : ON_ModelComponent(ON_ModelComponent::Type::LinePattern,src)
  , m_is_set_bits(src.m_is_set_bits)
  , m_is_locked_bits(src.m_is_locked_bits)
  , m_cap_style(src.m_cap_style)
  , m_join_style(src.m_join_style)
  , m_width(src.m_width)
  , m_width_units(src.m_width_units)
{
  m_private = new ON_LinetypePrivate(*src.m_private);
}